

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRandom.h
# Opt level: O2

void __thiscall HighsRandom::initialise(HighsRandom *this,HighsUInt seed)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = (ulong)seed;
  lVar1 = uVar2 + 0x8a183895eeac1536;
  do {
    uVar3 = ((uVar2 & 0xffffffff) + 0xc8497d2a400d9551) * ((uVar2 >> 0x20) + 0x80c8963be3e4c2f3);
    uVar4 = ((uVar3 >> 0x20) + 0x42d8680e260ae5b) * lVar1 >> 0x20;
    uVar2 = uVar4 ^ uVar3;
  } while (uVar3 - uVar4 == 0);
  this->state = uVar2;
  return;
}

Assistant:

void initialise(HighsUInt seed = 0) {
    state = seed;
    do {
      state = HighsHashHelpers::pair_hash<0>(static_cast<uint32_t>(state),
                                             state >> 32);
      state ^= (HighsHashHelpers::pair_hash<1>(state >> 32, seed) >> 32);
    } while (state == 0);
  }